

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::SortImports::toplevelImport
          (SortImports *this,Local *local,ImportElems *imports,Fodder *groupOpenFodder)

{
  bool bVar1;
  AST *pAVar2;
  Local *pLVar3;
  AST *pAVar4;
  Fodder beforeNextFodder;
  Fodder adjacentCommentFodder;
  Fodder nextOpenFodder;
  Fodder afterGroup;
  ImportElems newImports;
  ImportElems nextImports;
  undefined1 local_f8 [8];
  pointer pFStack_f0;
  pointer local_e8;
  undefined1 local_d8 [16];
  pointer local_c8;
  Fodder local_c0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_a8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_90;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_78;
  ImportElems local_48;
  
  bVar1 = isGoodLocal(this,local);
  if (!bVar1) {
    __assert_fail("isGoodLocal(local)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                  ,0x8c6,
                  "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
                 );
  }
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_c8 = (pointer)0x0;
  local_f8 = (undefined1  [8])0x0;
  pFStack_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  pAVar2 = left_recursive_deep(local->body);
  splitFodder(&local_78,this,&pAVar2->openFodder);
  local_a8.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
  local_a8.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8;
  std::
  tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
  ::operator=((tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
               *)&local_a8,&local_78);
  std::
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  ::~pair(&local_78);
  ensureCleanNewline((Fodder *)local_d8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&local_90,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)local_d8);
  extractImportElems((ImportElems *)&local_78,this,&local->binds,&local_90);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_90);
  std::
  vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
  ::
  insert<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>,void>
            ((vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
              *)imports,
             (imports->
             super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
              )local_78.first.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
              )local_78.first.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  bVar1 = groupEndsAfter(this,local);
  if (bVar1) {
    sortGroup(this,imports);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector(&local_a8,
             &(imports->
              super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
              )._M_impl.super__Vector_impl_data._M_finish[-1].adjacentFodder);
    ensureCleanNewline((Fodder *)local_f8);
    concat_fodder(&local_c0,&local_a8,(Fodder *)local_f8);
    pLVar3 = goodLocalOrNull(this,local->body);
    if (pLVar3 == (Local *)0x0) {
      pAVar2 = local->body;
      pAVar4 = left_recursive_deep(pAVar2);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&pAVar4->openFodder,&local_c0);
    }
    else {
      local_48.
      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pAVar2 = toplevelImport(this,pLVar3,&local_48,&local_c0);
      std::
      vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ::~vector(&local_48);
    }
    pAVar2 = buildGroupAST(this,imports,pAVar2,groupOpenFodder);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_c0);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_a8);
  }
  else {
    if (local_f8 != (undefined1  [8])pFStack_f0) {
      __assert_fail("beforeNextFodder.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                    ,0x8e6,
                    "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
                   );
    }
    if (local->body == (AST *)0x0) {
      pLVar3 = (Local *)0x0;
    }
    else {
      pLVar3 = (Local *)__dynamic_cast(local->body,&AST::typeinfo,&Local::typeinfo,0);
    }
    pAVar2 = toplevelImport(this,pLVar3,imports,groupOpenFodder);
  }
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::~vector((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             *)&local_78);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)local_f8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)local_d8);
  return pAVar2;
}

Assistant:

AST *toplevelImport(Local *local, ImportElems &imports, const Fodder &groupOpenFodder)
    {
        assert(isGoodLocal(local));

        Fodder adjacentCommentFodder, beforeNextFodder;
        std::tie(adjacentCommentFodder, beforeNextFodder) = splitFodder(open_fodder(local->body));

        ensureCleanNewline(adjacentCommentFodder);

        ImportElems newImports = extractImportElems(local->binds, adjacentCommentFodder);
        imports.insert(imports.end(), newImports.begin(), newImports.end());

        if (groupEndsAfter(local)) {
            sortGroup(imports);

            Fodder afterGroup = imports.back().adjacentFodder;
            ensureCleanNewline(beforeNextFodder);
            auto nextOpenFodder = concat_fodder(afterGroup, beforeNextFodder);

            // Process the code after the current group:
            AST *bodyAfterGroup;
            Local *next = goodLocalOrNull(local->body);
            if (next) {
                // Another group of imports
                ImportElems nextImports;
                bodyAfterGroup = toplevelImport(next, nextImports, nextOpenFodder);
            } else {
                // Something else
                bodyAfterGroup = local->body;
                open_fodder(bodyAfterGroup) = nextOpenFodder;
            }

            return buildGroupAST(imports, bodyAfterGroup, groupOpenFodder);
        } else {
            assert(beforeNextFodder.empty());
            return toplevelImport(dynamic_cast<Local *>(local->body), imports, groupOpenFodder);
        }
    }